

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O1

void __thiscall SkipList::SkipList(SkipList *this)

{
  pointer ppEVar1;
  value_type *__val;
  pointer ppEVar2;
  allocator_type local_19;
  
  this->MAX_HEIGHT = 0x10;
  this->INF = 0x7fffffff;
  (this->head).value = 0;
  std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::vector
            (&(this->head).next,0x11,&local_19);
  (this->tail).value = this->INF;
  (this->tail).next.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tail).next.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tail).next.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppEVar2 = (pointer)operator_new(8);
  (this->tail).next.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>.
  _M_impl.super__Vector_impl_data._M_start = ppEVar2;
  (this->tail).next.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppEVar2;
  (this->tail).next.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = ppEVar2 + 1;
  *ppEVar2 = (Element *)0x0;
  (this->tail).next.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppEVar2 + 1;
  this->height = 0;
  ppEVar2 = (this->head).next.
            super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar1 = (this->head).next.
            super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar2 != ppEVar1) {
    do {
      *ppEVar2 = &this->tail;
      ppEVar2 = ppEVar2 + 1;
    } while (ppEVar2 != ppEVar1);
  }
  return;
}

Assistant:

SkipList::SkipList() : head(0, MAX_HEIGHT), tail(INF, 0), height(0) {
    for (auto &i : head.next) {
        i = &tail;
    }
}